

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool GetLineIsoCoordinates(ON_Line *line,ON_3dPoint P,ON_3dPoint *C)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  double local_38;
  double local_30;
  double local_28;
  ON_3dPoint *C_local;
  ON_Line *line_local;
  
  dVar2 = (line->from).x;
  if ((dVar2 != (line->to).x) || (NAN(dVar2) || NAN((line->to).x))) {
    local_28 = -1.23432101234321e+308;
  }
  else {
    local_28 = P.x;
  }
  C->x = local_28;
  dVar2 = (line->from).y;
  pdVar1 = &(line->to).y;
  if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
    local_30 = -1.23432101234321e+308;
  }
  else {
    local_30 = P.y;
  }
  C->y = local_30;
  dVar2 = (line->from).z;
  pdVar1 = &(line->to).z;
  if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
    local_38 = -1.23432101234321e+308;
  }
  else {
    local_38 = P.z;
  }
  C->z = local_38;
  bVar3 = ON_3dPoint::operator!=(&ON_3dPoint::UnsetPoint,C);
  return bVar3;
}

Assistant:

static bool GetLineIsoCoordinates( const ON_Line& line, const ON_3dPoint P, ON_3dPoint& C )
{
  C.x = (line.from.x == line.to.x) ? P.x : ON_UNSET_VALUE;
  C.y = (line.from.y == line.to.y) ? P.y : ON_UNSET_VALUE;
  C.z = (line.from.z == line.to.z) ? P.z : ON_UNSET_VALUE;
  return ( ON_3dPoint::UnsetPoint != C );
}